

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

DdNode * extraTransferPermuteRecur
                   (DdManager *ddS,DdManager *ddD,DdNode *f,st__table *table,int *Permute)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  abctime aVar4;
  uint *puVar5;
  DdNode *h;
  ulong uVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  uint *key;
  DdNode *res;
  DdNode *local_58;
  uint local_4c;
  DdNode *local_48;
  DdNode *local_40;
  int *local_38;
  
  pDVar7 = ddD->one;
  key = (uint *)((ulong)f & 0xfffffffffffffffe);
  uVar6 = (ulong)((uint)f & 1);
  if (*key == 0x7fffffff) {
    pDVar7 = (DdNode *)(uVar6 ^ (ulong)pDVar7);
  }
  else {
    local_38 = Permute;
    iVar3 = st__lookup(table,(char *)key,(char **)&local_58);
    if (iVar3 == 0) {
      if (((ddS->TimeStop == 0) || (aVar4 = Abc_Clock(), aVar4 <= ddS->TimeStop)) &&
         ((ddD->TimeStop == 0 || (aVar4 = Abc_Clock(), aVar4 <= ddD->TimeStop)))) {
        piVar2 = local_38;
        puVar5 = key;
        if (local_38 != (int *)0x0) {
          puVar5 = (uint *)(local_38 + *key);
        }
        local_4c = *puVar5;
        local_40 = *(DdNode **)(key + 6);
        local_48 = extraTransferPermuteRecur(ddS,ddD,*(DdNode **)(key + 4),table,local_38);
        if (local_48 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)local_48 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          h = extraTransferPermuteRecur(ddS,ddD,local_40,table,piVar2);
          pDVar8 = local_48;
          if (h != (DdNode *)0x0) {
            piVar2 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
            *piVar2 = *piVar2 + 1;
            pDVar7 = cuddUniqueInter(ddD,local_4c,pDVar7,(DdNode *)((ulong)ddD->one ^ 1));
            if ((pDVar7 == (DdNode *)0x0) ||
               (local_58 = cuddBddIteRecur(ddD,pDVar7,pDVar8,h), local_58 == (DdNode *)0x0)) {
              Cudd_RecursiveDeref(ddD,pDVar8);
              pDVar8 = h;
            }
            else {
              piVar2 = (int *)(((ulong)local_58 & 0xfffffffffffffffe) + 4);
              *piVar2 = *piVar2 + 1;
              Cudd_RecursiveDeref(ddD,pDVar8);
              Cudd_RecursiveDeref(ddD,h);
              iVar3 = st__add_direct(table,(char *)key,(char *)local_58);
              pDVar8 = local_58;
              if (iVar3 != -10000) {
                return (DdNode *)(uVar6 ^ (ulong)local_58);
              }
            }
          }
          Cudd_RecursiveDeref(ddD,pDVar8);
        }
      }
      pDVar7 = (DdNode *)0x0;
    }
    else {
      pDVar7 = (DdNode *)(uVar6 ^ (ulong)local_58);
    }
  }
  return pDVar7;
}

Assistant:

static DdNode * 
extraTransferPermuteRecur( 
  DdManager * ddS, 
  DdManager * ddD, 
  DdNode * f, 
  st__table * table, 
  int * Permute )
{
    DdNode *ft, *fe, *t, *e, *var, *res;
    DdNode *one, *zero;
    int index;
    int comple = 0;

    statLine( ddD );
    one = DD_ONE( ddD );
    comple = Cudd_IsComplement( f );

    /* Trivial cases. */
    if ( Cudd_IsConstant( f ) )
        return ( Cudd_NotCond( one, comple ) );


    /* Make canonical to increase the utilization of the cache. */
    f = Cudd_NotCond( f, comple );
    /* Now f is a regular pointer to a non-constant node. */

    /* Check the cache. */
    if ( st__lookup( table, ( char * ) f, ( char ** ) &res ) )
        return ( Cudd_NotCond( res, comple ) );

    if ( ddS->TimeStop && Abc_Clock() > ddS->TimeStop )
        return NULL;
    if ( ddD->TimeStop && Abc_Clock() > ddD->TimeStop )
        return NULL;

    /* Recursive step. */
    if ( Permute )
        index = Permute[f->index];
    else
        index = f->index;

    ft = cuddT( f );
    fe = cuddE( f );

    t = extraTransferPermuteRecur( ddS, ddD, ft, table, Permute );
    if ( t == NULL )
    {
        return ( NULL );
    }
    cuddRef( t );

    e = extraTransferPermuteRecur( ddS, ddD, fe, table, Permute );
    if ( e == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        return ( NULL );
    }
    cuddRef( e );

    zero = Cudd_Not(ddD->one);
    var = cuddUniqueInter( ddD, index, one, zero );
    if ( var == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        Cudd_RecursiveDeref( ddD, e );
        return ( NULL );
    }
    res = cuddBddIteRecur( ddD, var, t, e );

    if ( res == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        Cudd_RecursiveDeref( ddD, e );
        return ( NULL );
    }
    cuddRef( res );
    Cudd_RecursiveDeref( ddD, t );
    Cudd_RecursiveDeref( ddD, e );

    if ( st__add_direct( table, ( char * ) f, ( char * ) res ) ==
         st__OUT_OF_MEM )
    {
        Cudd_RecursiveDeref( ddD, res );
        return ( NULL );
    }
    return ( Cudd_NotCond( res, comple ) );

}